

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPath.cpp
# Opt level: O0

void __thiscall CppUnit::TestPath::TestPath(TestPath *this,TestPath *other,int indexFirst,int count)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  int local_38;
  int index;
  int local_24;
  int local_20;
  int countAdjustment;
  int count_local;
  int indexFirst_local;
  TestPath *other_local;
  TestPath *this_local;
  
  this->_vptr_TestPath = (_func_int **)&PTR__TestPath_001a2138;
  memset(&this->m_tests,0,0x50);
  std::deque<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>::deque(&this->m_tests);
  local_24 = 0;
  countAdjustment = indexFirst;
  if (indexFirst < 0) {
    countAdjustment = 0;
    local_24 = indexFirst;
  }
  if (count < 0) {
    local_20 = (*other->_vptr_TestPath[10])();
  }
  else {
    local_20 = local_24 + count;
  }
  local_38 = countAdjustment;
  while( true ) {
    bVar1 = false;
    if (0 < local_20) {
      iVar2 = (*other->_vptr_TestPath[10])();
      bVar1 = local_38 < iVar2;
    }
    if (!bVar1) break;
    local_38 = local_38 + 1;
    iVar2 = (*other->_vptr_TestPath[0xb])();
    (*this->_vptr_TestPath[3])(this,CONCAT44(extraout_var,iVar2));
    local_20 = local_20 + -1;
  }
  return;
}

Assistant:

TestPath::TestPath( const TestPath &other, 
                    int indexFirst, 
                    int count )
    : m_tests()
{
  int countAdjustment = 0;
  if ( indexFirst < 0 )
  {
    countAdjustment = indexFirst;
    indexFirst = 0;
  }

  if ( count < 0 )
    count = other.getTestCount();
  else
    count += countAdjustment;

  int index = indexFirst;
  while ( count-- > 0  &&  index < other.getTestCount() )
    add( other.getTestAt( index++ ) );
}